

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_backup_finish(sqlite3_backup *p)

{
  int *piVar1;
  sqlite3 *db;
  sqlite3_mutex *psVar2;
  Btree *pBVar3;
  sqlite3_backup *psVar4;
  sqlite3 *db_00;
  sqlite3_backup **ppsVar5;
  sqlite3_backup **ppsVar6;
  int err_code;
  
  if (p == (sqlite3_backup *)0x0) {
    err_code = 0;
  }
  else {
    db = p->pSrcDb;
    psVar2 = db->mutex;
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    pBVar3 = p->pSrc;
    if ((pBVar3->sharable != '\0') &&
       (pBVar3->wantToLock = pBVar3->wantToLock + 1, pBVar3->locked == '\0')) {
      btreeLockCarefully(pBVar3);
    }
    if ((p->pDestDb != (sqlite3 *)0x0) &&
       (psVar2 = p->pDestDb->mutex, psVar2 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    if (p->pDestDb != (sqlite3 *)0x0) {
      piVar1 = &p->pSrc->nBackup;
      *piVar1 = *piVar1 + -1;
    }
    if (p->isAttached != 0) {
      ppsVar5 = &p->pSrc->pBt->pPager->pBackup;
      do {
        ppsVar6 = ppsVar5;
        psVar4 = *ppsVar6;
        ppsVar5 = &psVar4->pNext;
      } while (psVar4 != p);
      *ppsVar6 = p->pNext;
    }
    sqlite3BtreeRollback(p->pDest,0,0);
    err_code = p->rc;
    if (p->rc == 0x65) {
      err_code = 0;
    }
    db_00 = p->pDestDb;
    if (db_00 != (sqlite3 *)0x0) {
      db_00->errCode = err_code;
      if ((err_code == 0) && (db_00->pErr == (sqlite3_value *)0x0)) {
        db_00->errByteOffset = -1;
      }
      else {
        sqlite3ErrorFinish(db_00,err_code);
      }
      sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
    }
    pBVar3 = p->pSrc;
    if (pBVar3->sharable != '\0') {
      piVar1 = &pBVar3->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(pBVar3);
      }
    }
    if (p->pDestDb != (sqlite3 *)0x0) {
      sqlite3_free(p);
    }
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return err_code;
}

Assistant:

SQLITE_API int sqlite3_backup_finish(sqlite3_backup *p){
  sqlite3_backup **pp;                 /* Ptr to head of pagers backup list */
  sqlite3 *pSrcDb;                     /* Source database connection */
  int rc;                              /* Value to return */

  /* Enter the mutexes */
  if( p==0 ) return SQLITE_OK;
  pSrcDb = p->pSrcDb;
  sqlite3_mutex_enter(pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  /* Detach this backup from the source pager. */
  if( p->pDestDb ){
    p->pSrc->nBackup--;
  }
  if( p->isAttached ){
    pp = sqlite3PagerBackupPtr(sqlite3BtreePager(p->pSrc));
    assert( pp!=0 );
    while( *pp!=p ){
      pp = &(*pp)->pNext;
      assert( pp!=0 );
    }
    *pp = p->pNext;
  }

  /* If a transaction is still open on the Btree, roll it back. */
  sqlite3BtreeRollback(p->pDest, SQLITE_OK, 0);

  /* Set the error code of the destination database handle. */
  rc = (p->rc==SQLITE_DONE) ? SQLITE_OK : p->rc;
  if( p->pDestDb ){
    sqlite3Error(p->pDestDb, rc);

    /* Exit the mutexes and free the backup context structure. */
    sqlite3LeaveMutexAndCloseZombie(p->pDestDb);
  }
  sqlite3BtreeLeave(p->pSrc);
  if( p->pDestDb ){
    /* EVIDENCE-OF: R-64852-21591 The sqlite3_backup object is created by a
    ** call to sqlite3_backup_init() and is destroyed by a call to
    ** sqlite3_backup_finish(). */
    sqlite3_free(p);
  }
  sqlite3LeaveMutexAndCloseZombie(pSrcDb);
  return rc;
}